

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

bool __thiscall
Jinx::Impl::Runtime::SetProperty(Runtime *this,RuntimeID id,function<bool_(Jinx::Variant_&)> *fn)

{
  bool bVar1;
  mapped_type *__args;
  RuntimeID local_30;
  
  local_30 = id;
  std::mutex::lock(&this->m_propertyMutex);
  __args = std::
           map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
           ::operator[](&this->m_propertyMap,&local_30);
  bVar1 = std::function<bool_(Jinx::Variant_&)>::operator()(fn,__args);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
  return bVar1;
}

Assistant:

inline_t bool Runtime::SetProperty(RuntimeID id, std::function<bool(Variant &)> fn)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto& prop = m_propertyMap[id];
		return fn(prop);
	}